

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t helper_m68k_movec_from_m68k(CPUM68KState_conflict *env,uint32_t reg)

{
  CPUState *cpu;
  uint32_t reg_local;
  CPUM68KState_conflict *env_local;
  
  if (reg == 0) {
    env_local._4_4_ = env->sfc;
  }
  else if (reg == 1) {
    env_local._4_4_ = env->dfc;
  }
  else if (reg == 2) {
    env_local._4_4_ = env->cacr;
  }
  else if (reg == 3) {
    env_local._4_4_ = (uint)(env->mmu).tcr;
  }
  else if (reg == 4) {
    env_local._4_4_ = (env->mmu).ttr[2];
  }
  else if (reg == 5) {
    env_local._4_4_ = (env->mmu).ttr[3];
  }
  else if (reg == 6) {
    env_local._4_4_ = (env->mmu).ttr[0];
  }
  else if (reg == 7) {
    env_local._4_4_ = (env->mmu).ttr[1];
  }
  else if (reg == 0x800) {
    env_local._4_4_ = env->sp[1];
  }
  else if (reg == 0x801) {
    env_local._4_4_ = env->vbr;
  }
  else if (reg == 0x803) {
    env_local._4_4_ = env->sp[0];
  }
  else if (reg == 0x804) {
    env_local._4_4_ = env->sp[2];
  }
  else if (reg == 0x805) {
    env_local._4_4_ = (env->mmu).mmusr;
  }
  else if (reg == 0x806) {
    env_local._4_4_ = (env->mmu).urp;
  }
  else {
    if (reg != 0x807) {
      cpu = env_cpu(env);
      cpu_abort_m68k(cpu,"Unimplemented control register read 0x%x\n",(ulong)reg);
    }
    env_local._4_4_ = (env->mmu).srp;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(m68k_movec_from)(CPUM68KState *env, uint32_t reg)
{
    switch (reg) {
    /* MC680[1234]0 */
    case M68K_CR_SFC:
        return env->sfc;
    case M68K_CR_DFC:
        return env->dfc;
    case M68K_CR_VBR:
        return env->vbr;
    /* MC680[234]0 */
    case M68K_CR_CACR:
        return env->cacr;
    /* MC680[34]0 */
    case M68K_CR_TC:
        return env->mmu.tcr;
    case M68K_CR_MMUSR:
        return env->mmu.mmusr;
    case M68K_CR_SRP:
        return env->mmu.srp;
    case M68K_CR_USP:
        return env->sp[M68K_USP];
    case M68K_CR_MSP:
        return env->sp[M68K_SSP];
    case M68K_CR_ISP:
        return env->sp[M68K_ISP];
    /* MC68040/MC68LC040 */
    case M68K_CR_URP:
        return env->mmu.urp;
    case M68K_CR_ITT0:
        return env->mmu.ttr[M68K_ITTR0];
    case M68K_CR_ITT1:
        return env->mmu.ttr[M68K_ITTR1];
    case M68K_CR_DTT0:
        return env->mmu.ttr[M68K_DTTR0];
    case M68K_CR_DTT1:
        return env->mmu.ttr[M68K_DTTR1];
    }
    cpu_abort(env_cpu(env), "Unimplemented control register read 0x%x\n",
              reg);
}